

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::Attribute_Access<int,_chaiscript::File_Position>::~Attribute_Access
          (Attribute_Access<int,_chaiscript::File_Position> *this)

{
  Proxy_Function_Base::~Proxy_Function_Base(&this->super_Proxy_Function_Base);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~Attribute_Access() {}